

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_strexp_expand(lws_strexp_t *exp,char *in,size_t len,size_t *pused_in,size_t *pused_out)

{
  size_t *psVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  
  psVar1 = &exp->pos;
  sVar6 = 0;
  do {
    if (len == sVar6) {
      iVar4 = 0;
      if (exp->out != (char *)0x0) {
        exp->out[*psVar1] = '\0';
      }
LAB_00119797:
      *pused_in = len;
      *pused_out = *psVar1;
      return iVar4;
    }
    switch(exp->state) {
    case '\0':
      if (in[sVar6] == '$') {
        exp->state = '\x01';
      }
      else {
        sVar5 = exp->pos;
        if (exp->out != (char *)0x0) {
          exp->out[sVar5] = in[sVar6];
          sVar5 = *psVar1;
        }
        exp->pos = sVar5 + 1;
        if (exp->olen == sVar5 + 1) {
          len = sVar6 + 1;
          iVar4 = 1;
          goto LAB_00119797;
        }
      }
      break;
    case '\x01':
      if (in[sVar6] != '{') {
        sVar5 = exp->pos;
        if (exp->olen - sVar5 < 3) {
          return -1;
        }
        if (exp->out == (char *)0x0) {
          *psVar1 = sVar5 + 2;
        }
        else {
          exp->pos = sVar5 + 1;
          exp->out[sVar5] = '$';
          cVar2 = in[sVar6];
          sVar5 = exp->pos;
          exp->pos = sVar5 + 1;
          exp->out[sVar5] = cVar2;
        }
        if (in[sVar6] == '$') break;
        goto LAB_001196cb;
      }
      exp->name_pos = '\0';
      exp->state = '\x02';
      exp->exp_ofs = 0;
      break;
    case '\x02':
      cVar2 = in[sVar6];
      bVar3 = exp->name_pos;
      if (cVar2 == '}') {
        exp->name[bVar3] = '\0';
        exp->state = '\x03';
        goto switchD_00119658_caseD_3;
      }
      if (0x1e < bVar3) {
        return -1;
      }
      exp->name_pos = bVar3 + 1;
      exp->name[bVar3] = cVar2;
      break;
    case '\x03':
switchD_00119658_caseD_3:
      *pused_in = sVar6;
      iVar4 = (*exp->cb)(exp->priv,exp->name,exp->out,psVar1,exp->olen,&exp->exp_ofs);
      *pused_out = exp->pos;
      if (iVar4 == -2) {
        return -2;
      }
      if (iVar4 == 1) {
        return 1;
      }
LAB_001196cb:
      exp->state = '\0';
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

int
lws_strexp_expand(lws_strexp_t *exp, const char *in, size_t len,
		  size_t *pused_in, size_t *pused_out)
{
	size_t used = 0;
	int n;

	while (used < len) {

		switch (exp->state) {
		case LWS_EXPS_LITERAL:
			if (*in == '$') {
				exp->state = LWS_EXPS_OPEN_OR_LIT;
				break;
			}

			if (exp->out)
				exp->out[exp->pos] = *in;
			exp->pos++;
			if (exp->olen - exp->pos < 1) {
				*pused_in = used + 1;
				*pused_out = exp->pos;
				return LSTRX_FILLED_OUT;
			}
			break;

		case LWS_EXPS_OPEN_OR_LIT:
			if (*in == '{') {
				exp->state = LWS_EXPS_NAME_OR_CLOSE;
				exp->name_pos = 0;
				exp->exp_ofs = 0;
				break;
			}
			/* treat as a literal */
			if (exp->olen - exp->pos < 3)
				return -1;

			if (exp->out) {
				exp->out[exp->pos++] = '$';
				exp->out[exp->pos++] = *in;
			} else
				exp->pos += 2;
			if (*in != '$')
				exp->state = LWS_EXPS_LITERAL;
			break;

		case LWS_EXPS_NAME_OR_CLOSE:
			if (*in == '}') {
				exp->name[exp->name_pos] = '\0';
				exp->state = LWS_EXPS_DRAIN;
				goto drain;
			}
			if (exp->name_pos >= sizeof(exp->name) - 1)
				return LSTRX_FATAL_NAME_TOO_LONG;

			exp->name[exp->name_pos++] = *in;
			break;

		case LWS_EXPS_DRAIN:
drain:
			*pused_in = used;
			n = exp->cb(exp->priv, exp->name, exp->out, &exp->pos,
				    exp->olen, &exp->exp_ofs);
			*pused_out = exp->pos;
			if (n == LSTRX_FILLED_OUT ||
			    n == LSTRX_FATAL_NAME_UNKNOWN)
				return n;

			exp->state = LWS_EXPS_LITERAL;
			break;
		}

		used++;
		in++;
	}

	if (exp->out)
		exp->out[exp->pos] = '\0';
	*pused_in = used;
	*pused_out = exp->pos;

	return LSTRX_DONE;
}